

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

Expression * soul::ExpressionHelpers::createStruct(Expression *__return_storage_ptr__,Structure *s)

{
  string *psVar1;
  TypeDeclarationBase *t;
  string local_b0;
  string local_90;
  string local_60;
  string local_40;
  soul *local_20;
  StructDeclaration *structDecl;
  Structure *s_local;
  
  local_20 = (soul *)s->backlinkToASTObject;
  structDecl = (StructDeclaration *)s;
  s_local = (Structure *)__return_storage_ptr__;
  if (local_20 == (soul *)0x0) {
    psVar1 = Structure::getName_abi_cxx11_(s);
    std::__cxx11::string::string((string *)&local_90,(string *)psVar1);
    std::__cxx11::string::string((string *)&local_b0);
    createStruct(__return_storage_ptr__,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    psVar1 = Structure::getName_abi_cxx11_(s);
    std::__cxx11::string::string((string *)&local_40,(string *)psVar1);
    makeUID_abi_cxx11_(&local_60,local_20,t);
    createStruct(__return_storage_ptr__,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression createStruct (Structure& s)
    {
        if (auto structDecl = reinterpret_cast<AST::StructDeclaration*> (s.backlinkToASTObject))
            return createStruct (s.getName(), makeUID (*structDecl));

        return createStruct (s.getName(), {});
    }